

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1482a::TestCheckArrayEqualFalse::RunImpl(TestCheckArrayEqualFalse *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int array2 [3];
  int array1 [3];
  TestResults results;
  int local_80 [2];
  TestDetails local_78;
  int local_58 [4];
  int local_48 [4];
  TestResults local_38;
  
  UnitTest::TestResults::TestResults(&local_38,(TestReporter *)0x0);
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_58[0] = 1;
  local_58[1] = 2;
  local_58[2] = 2;
  UnitTest::TestDetails::TestDetails(&local_78,"","","",0);
  UnitTest::CheckArrayEqual<int[3],int[3]>
            (&local_38,(int (*) [3])local_48,(int (*) [3])local_58,3,&local_78);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_80[1] = 1;
  local_80[0] = UnitTest::TestResults::GetFailureCount(&local_38);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar2,200);
  UnitTest::CheckEqual<int,int>(results_00,local_80 + 1,local_80,&local_78);
  return;
}

Assistant:

TEST(CheckArrayEqualFalse)
{
    TestResults results;

    int const array1[3] = { 1, 2, 3 };
    int const array2[3] = { 1, 2, 2 };
    CheckArrayEqual(results, array1, array2, 3, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}